

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::quadratic_cost_type<long_double>::
make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (quadratic_cost_type<long_double> *this,int n,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng)

{
  longdouble max;
  longdouble min;
  longdouble *plVar1;
  pointer end;
  __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
  _Var2;
  pointer p2x;
  long lVar3;
  __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
  begin;
  __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
  end_00;
  ulong uVar4;
  long in_R8;
  pointer ppVar5;
  longdouble in_ST0;
  allocator_type local_69;
  vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_> r;
  vector<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>_>
  q;
  
  std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::vector
            (&r,(long)n,(allocator_type *)&q);
  std::
  vector<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>_>
  ::vector(&q,(long)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                    _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                    super__Head_base<0UL,_int_*,_false>._M_head_impl[n],&local_69);
  plVar1 = (this->linear_elements)._M_t.
           super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
           super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
           super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
  lVar3 = 8;
  for (uVar4 = 0; (uint)n != uVar4; uVar4 = uVar4 + 1) {
    *(unkbyte10 *)
     ((long)r.
            super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start + lVar3 * 2 + -0x10) =
         *(unkbyte10 *)((long)plVar1 + lVar3 + -8);
    *(int *)((long)&(r.
                     super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->first + lVar3 * 2) = (int)uVar4;
    lVar3 = lVar3 + 0x10;
  }
  p2x = r.
        super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::quadratic_cost_type<long_double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
            (r.
             super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             r.
             super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  end = r.
        super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  begin._M_current =
       r.
       super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = r.
           super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (end_00._M_current =
            r.
            super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start; end_00._M_current != end;
      end_00._M_current = end_00._M_current + 1) {
    max = (end_00._M_current)->first;
    min = (begin._M_current)->first;
    if (((max != min) || (_Var2._M_current = begin._M_current, NAN(max) || NAN(min))) &&
       (p2x = (pointer)((long)ppVar5 - (long)begin._M_current), _Var2._M_current = end_00._M_current
       , 0x20 < (long)p2x)) {
      random_epsilon_unique<long_double,__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>>
                (begin,end_00,rng,min,max);
    }
    ppVar5 = ppVar5 + 1;
    begin._M_current = _Var2._M_current;
  }
  if (0x20 < (long)end - (long)begin._M_current) {
    if ((long)begin._M_current -
        (long)r.
              super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0) {
      random_epsilon_unique<long_double,__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>>
                (begin,(__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                        )end,rng,(begin._M_current)->first,(longdouble)1 + (begin._M_current)->first
                );
    }
    else {
      linearize<long,long_double>
                ((longdouble *)0x0,
                 (baryonyx *)
                 ((long)begin._M_current -
                  (long)r.
                        super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5),
                 (long)r.
                       super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)r.
                       super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5,
                 (r.
                  super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first,(long)p2x,
                 (begin._M_current)->first,in_R8);
      random_epsilon_unique<long_double,__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>>
                (begin,(__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                        )end,rng,(begin._M_current)->first,in_ST0);
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::quadratic_cost_type<long_double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
            (r.
             super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  plVar1 = (this->linear_elements)._M_t.
           super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
           super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
           super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
  for (lVar3 = 0; (ulong)(uint)n << 4 != lVar3; lVar3 = lVar3 + 0x10) {
    *(unkbyte10 *)((long)plVar1 + lVar3) =
         *(unkbyte10 *)
          ((long)&(r.
                   super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first + lVar3 * 2);
  }
  make_loo_norm(this,n);
  std::
  _Vector_base<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>_>
  ::~_Vector_base(&q.
                   super__Vector_base<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<long_double>::quad,_int>_>_>
                 );
  std::_Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>::
  ~_Vector_base(&r.
                 super__Vector_base<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>
               );
  return;
}

Assistant:

void make_random_norm(int n, Random& rng)
    {
        std::vector<std::pair<Float, int>> r(n);
        std::vector<std::pair<quad, int>> q(indices[n]);

        for (int i = 0; i != n; ++i)
            r[i] = { linear_elements[i], i };

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.first < rhs.first;
        });

        {
            auto begin = r.begin();
            auto end = r.end();
            auto next = r.begin()++;
            for (; next != end; ++next) {
                if (next->first != begin->first) {
                    if (std::distance(begin, next) > 1)
                        random_epsilon_unique(
                          begin, next, rng, begin->first, next->first);

                    begin = next;
                }
            }

            if (std::distance(begin, end) > 1) {
                if (begin == r.begin()) {
                    random_epsilon_unique(
                      begin, end, rng, begin->first, begin->first + 1);
                } else {
                    auto value = linearize(std::ptrdiff_t(0),
                                           r.front().first,
                                           std::distance(r.begin(), begin),
                                           begin->first,
                                           std::distance(r.begin(), r.end()));

                    random_epsilon_unique(
                      begin, end, rng, begin->first, value);
                }
            }

            // Reorder the vector according to the variable index, so,
            // it restores the initial order.

            std::sort(
              r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
                  return lhs.second < rhs.second;
              });
        }

        {
            // auto begin = q.begin();
            // auto end = q.end();
            // auto next = q.begin()++;
            // for (; next != end; ++next) {
            //     if (next->first != begin->first) {
            //         if (std::distance(begin, next) > 1)
            //             random_epsilon_unique(
            //               begin, next, rng, begin->first,
            //               next->first);

            //         begin = next;
            //     }
            // }

            // if (std::distance(begin, end) > 1) {
            //     if (begin == q.begin()) {
            //         random_epsilon_unique(
            //           begin, end, rng, begin->first, begin->first +
            //           1);
            //     } else {
            //         auto value = linearize(std::ptrdiff_t(0),
            //                                q.front().first,
            //                                std::distance(q.begin(),
            //                                begin), begin->first,
            //                                std::distance(q.begin(),
            //                                q.end()));

            //         random_epsilon_unique(
            //           begin, end, rng, begin->first, value);
            //     }
            // }

            // Reorder the vector according to the variable index, so,
            // it restores the initial order.

            // std::sort(
            //   q.begin(), q.end(), [](const auto& lhs, const auto&
            //   rhs) {
            //       return lhs.second < rhs.second;
            //   });
        }

        for (int i = 0; i != n; ++i)
            linear_elements[i] = r[i].first;
        // for (int i = 0; i != n; ++i) {
        //     quadratic_elements[i].factor = r[i].first.factor;

        // Finally we compute the l+oo norm.
        make_loo_norm(n);
    }